

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O3

void __thiscall
stackjit::ByteCodeParser::parseAttribute(ByteCodeParser *this,AttributeContainer *container)

{
  int iVar1;
  int iVar2;
  const_iterator cVar3;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  const_iterator cVar4;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  __hashtable *__h;
  string attributeName;
  __hashtable *__h_1;
  string value;
  string key;
  Attribute attribute;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>
  local_1e8;
  string local_170;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_150;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Attribute local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  nextToken_abi_cxx11_(&local_170,this);
  nextToken_abi_cxx11_(&local_1e8.first,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
    operator_delete(local_1e8.first._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Expected \'(\' after attribute name");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&container->_M_h,&local_170);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_true>
      ._M_cur != (__node_type *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8.mName,"The attribute \'",&local_170);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_1e8.first._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_1e8.first._M_dataplus._M_p == psVar8) {
      local_1e8.first.field_2._M_allocated_capacity = *psVar8;
      local_1e8.first.field_2._8_8_ = plVar7[3];
      local_1e8.first._M_dataplus._M_p = (pointer)&local_1e8.first.field_2;
    }
    else {
      local_1e8.first.field_2._M_allocated_capacity = *psVar8;
    }
    local_1e8.first._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_170._M_dataplus._M_p,
             local_170._M_dataplus._M_p + local_170._M_string_length);
  Loader::Attribute::Attribute(&local_a8,&local_e8);
  local_150 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)container;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  do {
    nextToken_abi_cxx11_(&local_128,this);
    iVar1 = std::__cxx11::string::compare((char *)&local_128);
    if (iVar1 != 0) {
      nextToken_abi_cxx11_(&local_1e8.first,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
        operator_delete(local_1e8.first._M_dataplus._M_p);
      }
      if (iVar2 != 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Expected \'=\' after name in attribute.");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      nextToken_abi_cxx11_(&local_148,this);
      this_00 = &Loader::Attribute::values_abi_cxx11_(&local_a8)->_M_h;
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,&local_128);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_c8,"The key \'",&local_128);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_108._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_108._M_dataplus._M_p == psVar8) {
          local_108.field_2._M_allocated_capacity = *psVar8;
          local_108.field_2._8_8_ = plVar7[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar8;
        }
        local_108._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::operator+(&local_50,&local_108,&local_170);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_1e8.first._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_1e8.first._M_dataplus._M_p == psVar8) {
          local_1e8.first.field_2._M_allocated_capacity = *psVar8;
          local_1e8.first.field_2._8_8_ = plVar7[3];
          local_1e8.first._M_dataplus._M_p = (pointer)&local_1e8.first.field_2;
        }
        else {
          local_1e8.first.field_2._M_allocated_capacity = *psVar8;
        }
        local_1e8.first._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_1e8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      p_Var5 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)Loader::Attribute::values_abi_cxx11_(&local_a8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,&local_128,&local_148);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>(p_Var5,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.second.mName._M_dataplus._M_p != &local_1e8.second.mName.field_2) {
        operator_delete(local_1e8.second.mName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
        operator_delete(local_1e8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  } while (iVar1 != 0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_stackjit::Loader::Attribute_&,_true>
            (&local_1e8,&local_170,&local_a8);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>
            (local_150,&local_1e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e8.second.mValues._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.second.mName._M_dataplus._M_p != &local_1e8.second.mName.field_2) {
    operator_delete(local_1e8.second.mName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
    operator_delete(local_1e8.first._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a8.mValues._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.mName._M_dataplus._M_p != &local_a8.mName.field_2) {
    operator_delete(local_a8.mName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ByteCodeParser::parseAttribute(Loader::AttributeContainer& container) {
		auto attributeName = nextToken();

		if (nextToken() != "(") {
			throw std::runtime_error("Expected '(' after attribute name");
		}

		if (container.count(attributeName) > 0) {
			throw std::runtime_error("The attribute '" + attributeName + "' is already defined.'");
		}

		Loader::Attribute attribute(attributeName);

		while (true) {
			auto key = nextToken();

			if (key == ")") {
				break;
			}

			if (nextToken() != "=") {
				throw std::runtime_error("Expected '=' after name in attribute.");
			}

			auto value = nextToken();

			if (attribute.values().count(key) == 0) {
				attribute.values().insert({key, value});
			} else {
				throw std::runtime_error("The key '" + key + "' is already defined in the attribute '" + attributeName + "'.");
			}
		}

		container.insert({attributeName, attribute});
	}